

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_custom_4d(ggml_context *ctx,ggml_type type,int64_t ne0,int64_t ne1,int64_t ne2,int64_t ne3,
              ggml_tensor **args,int n_args,ggml_custom_op_t fun,int n_tasks,void *userdata)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  ulong uVar3;
  char *file;
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  int64_t local_10;
  
  if (n_args < 10) {
    local_28 = ne0;
    local_20 = ne1;
    local_18 = ne2;
    local_10 = ne3;
    pgVar1 = ggml_new_tensor_impl(ctx,type,4,&local_28,(ggml_tensor *)0x0,0);
    if (pgVar1 != (ggml_tensor *)0x0) {
      *(ggml_custom_op_t *)pgVar1->op_params = fun;
      pgVar1->op_params[2] = n_tasks;
      *(void **)(pgVar1->op_params + 4) = userdata;
      pgVar1->op = GGML_OP_CUSTOM;
      if (0 < n_args) {
        uVar3 = 0;
        do {
          pgVar1->src[uVar3] = args[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)n_args != uVar3);
      }
      return pgVar1;
    }
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
    pcVar2 = "tensor != NULL";
    line = 0x70;
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar2 = "n_args < GGML_MAX_SRC";
    line = 0x13b6;
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_custom_4d(
        struct ggml_context * ctx,
        enum ggml_type        type,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2,
        int64_t               ne3,
        struct ggml_tensor ** args,
        int                   n_args,
        ggml_custom_op_t      fun,
        int                   n_tasks,
        void                * userdata) {

    GGML_ASSERT(n_args < GGML_MAX_SRC);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, type, ne0, ne1, ne2, ne3);

    struct ggml_custom_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op = GGML_OP_CUSTOM;
    for (int i = 0; i < n_args; i++) {
        result->src[i] = args[i];
    }

    return result;
}